

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O3

bool google::protobuf::util::ParseDelimitedFromCodedStream
               (MessageLite *message,CodedInputStream *input,bool *clean_eof)

{
  byte bVar1;
  bool bVar2;
  Limit limit;
  ulong uVar3;
  byte *pbVar4;
  int iVar5;
  uint32_t first_byte_or_zero;
  byte *pbVar6;
  int local_3c;
  
  if (clean_eof != (bool *)0x0) {
    *clean_eof = false;
  }
  local_3c = input->total_bytes_read_;
  pbVar6 = input->buffer_;
  pbVar4 = input->buffer_end_;
  iVar5 = input->buffer_size_after_limit_;
  if (pbVar6 < pbVar4) {
    bVar1 = *pbVar6;
    uVar3 = (ulong)bVar1;
    first_byte_or_zero = (uint32_t)bVar1;
    if (-1 < (char)bVar1) {
      pbVar6 = pbVar6 + 1;
      input->buffer_ = pbVar6;
      goto LAB_00fbf005;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar3 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  if ((long)uVar3 < 0) {
    if (clean_eof == (bool *)0x0) {
      return false;
    }
    *clean_eof = (input->total_bytes_read_ - input->buffer_size_after_limit_) +
                 (*(int *)&input->buffer_ - *(int *)&input->buffer_end_) ==
                 (local_3c - iVar5) + ((int)pbVar6 - (int)pbVar4);
    return false;
  }
  local_3c = input->total_bytes_read_;
  pbVar6 = input->buffer_;
  pbVar4 = input->buffer_end_;
  iVar5 = input->buffer_size_after_limit_;
LAB_00fbf005:
  limit = io::CodedInputStream::PushLimit(input,(int)uVar3);
  bVar2 = MessageLite::MergeFromCodedStream(message,input);
  if (((bVar2) && (input->legitimate_message_end_ == true)) &&
     ((((iVar5 - local_3c) + ((int)pbVar4 - (int)pbVar6) + input->total_bytes_read_) -
      input->buffer_size_after_limit_) + (*(int *)&input->buffer_ - *(int *)&input->buffer_end_) ==
      (int)uVar3)) {
    io::CodedInputStream::PopLimit(input,limit);
    return true;
  }
  return false;
}

Assistant:

bool ParseDelimitedFromCodedStream(MessageLite* message,
                                   io::CodedInputStream* input,
                                   bool* clean_eof) {
  if (clean_eof != nullptr) *clean_eof = false;
  int start = input->CurrentPosition();

  // Read the size.
  uint32_t size;
  if (!input->ReadVarint32(&size)) {
    if (clean_eof != nullptr) *clean_eof = input->CurrentPosition() == start;
    return false;
  }

  // Get the position after any size bytes have been read (and only the message
  // itself remains).
  int position_after_size = input->CurrentPosition();

  // Tell the stream not to read beyond that size.
  io::CodedInputStream::Limit limit = input->PushLimit(static_cast<int>(size));

  // Parse the message.
  if (!message->MergeFromCodedStream(input)) return false;
  if (!input->ConsumedEntireMessage()) return false;
  if (input->CurrentPosition() - position_after_size != static_cast<int>(size))
    return false;

  // Release the limit.
  input->PopLimit(limit);

  return true;
}